

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

Variable __thiscall
LiteScript::_Type_CHARACTER::OAssign(_Type_CHARACTER *this,Variable *src,Variable *dest)

{
  String *pSVar1;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar5;
  Variable VVar6;
  Variable tmp;
  Variable local_80;
  String local_70;
  String local_50;
  
  pOVar3 = Variable::operator->((Variable *)in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(pTVar4,(Type *)_type_string);
  if (bVar2) {
    Variable::Convert(&local_80,in_RCX);
    pOVar3 = Variable::operator->(&local_80);
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator!=(pTVar4,(Type *)_type_string);
    if (bVar2) {
      Variable::Variable((Variable *)this,dest);
    }
    else {
      pOVar3 = Variable::operator->(&local_80);
      pSVar1 = (String *)pOVar3->data;
      pOVar3 = Variable::operator->(dest);
      Character::operator=(&local_50,(Character *)pOVar3->data,pSVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
        operator_delete(local_50.str._M_dataplus._M_p);
      }
    }
    Variable::~Variable(&local_80);
    puVar5 = extraout_RDX;
    if (bVar2) goto LAB_00121a20;
  }
  else {
    pOVar3 = Variable::operator->((Variable *)in_RCX);
    pSVar1 = (String *)pOVar3->data;
    pOVar3 = Variable::operator->(dest);
    Character::operator=(&local_70,(Character *)pOVar3->data,pSVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70.str._M_dataplus._M_p != &local_70.str.field_2) {
      operator_delete(local_70.str._M_dataplus._M_p);
    }
  }
  Variable::Variable((Variable *)this,dest);
  puVar5 = extraout_RDX_00;
LAB_00121a20:
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::OAssign(LiteScript::Variable& src, const LiteScript::Variable& dest) const {
    if (dest->GetType() != Type::STRING) {
        Variable tmp = dest.Convert(Type::STRING);
        if (tmp->GetType() != Type::STRING)
            return Variable(src);
        src->GetData<Character>() = tmp->GetData<String>();
    }
    else {
        src->GetData<Character>() = dest->GetData<String>();
    }
    return Variable(src);
}